

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::ValueExpectation::~ValueExpectation(ValueExpectation *this)

{
  ValueExpectation *this_local;
  
  ~ValueExpectation(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

explicit ValueExpectation(const Location& loc = Location())
      : ExpectationMixin<ExpectationType::Values>(loc) {}